

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O3

void __thiscall SessionManager::~SessionManager(SessionManager *this)

{
  pointer ppSVar1;
  pointer ppSVar2;
  MutexFactory *this_00;
  pointer ppSVar3;
  vector<Session_*,_std::allocator<Session_*>_> toDelete;
  vector<Session_*,_std::allocator<Session_*>_> local_30;
  
  this->_vptr_SessionManager = (_func_int **)&PTR__SessionManager_0019dcc8;
  std::vector<Session_*,_std::allocator<Session_*>_>::vector(&local_30,&this->sessions);
  ppSVar1 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar2 = local_30.super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppSVar3 = local_30.super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar1) {
    (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar1;
  }
  for (; ppSVar3 != ppSVar2; ppSVar3 = ppSVar3 + 1) {
    if (*ppSVar3 != (Session *)0x0) {
      (*(*ppSVar3)->_vptr_Session[1])();
      ppSVar2 = local_30.super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
  }
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,this->sessionsMutex);
  if (local_30.super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ppSVar1 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1);
  }
  return;
}

Assistant:

SessionManager::~SessionManager()
{
	std::vector<Session*> toDelete = sessions;
	sessions.clear();

	for (std::vector<Session*>::iterator i = toDelete.begin(); i != toDelete.end(); i++)
	{
		if (*i != NULL) delete *i;
	}

	MutexFactory::i()->recycleMutex(sessionsMutex);
}